

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O3

LPWSTR lstrcpyW(LPWSTR lpString1,LPCWSTR lpString2)

{
  WCHAR WVar1;
  LPWSTR pWVar2;
  WCHAR *pWVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpString2 == (LPCWSTR)0x0 || lpString1 == (LPWSTR)0x0) {
      lpString1 = (LPWSTR)0x0;
    }
    else {
      WVar1 = *lpString2;
      pWVar2 = lpString1;
      if (WVar1 != L'\0') {
        pWVar3 = lpString2 + 1;
        do {
          *pWVar2 = WVar1;
          pWVar2 = pWVar2 + 1;
          WVar1 = *pWVar3;
          pWVar3 = pWVar3 + 1;
        } while (WVar1 != L'\0');
      }
      *pWVar2 = L'\0';
    }
    return lpString1;
  }
  abort();
}

Assistant:

LPWSTR
PALAPI
lstrcpyW(
	 OUT LPWSTR lpString1,
	 IN LPCWSTR lpString2)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcpyW);
    ENTRY("lstrcpyW (lpString1=%p, lpString2=%p (%S))\n",
          lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcpyW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpyW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcpyW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpyW);
        return NULL;
    }

    /* copy source string to destination string */
    while(*lpString2)
    {
        *lpString1++ = *lpString2++;
    }

    /* add terminating null */
    *lpString1 = '\0';

    LOGEXIT("lstrcpyW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcpyW);
    return lpStart;
}